

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolor.cpp
# Opt level: O2

QString * __thiscall QColor::name(QString *__return_storage_ptr__,QColor *this,NameFormat format)

{
  QRgb QVar1;
  long in_FS_OFFSET;
  bool bVar2;
  ulong uStack_50;
  QArrayDataPointer<char16_t> QStack_48;
  QStringBuilder<char16_t,_QStringView> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (format == HexArgb) {
    QVar1 = rgba(this);
    QString::number((longlong)&QStack_48,QVar1);
    bVar2 = (ulong)QStack_48.size < 8;
    uStack_50 = 8;
  }
  else {
    if (format != HexRgb) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        (__return_storage_ptr__->d).d = (Data *)0x0;
        (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
        (__return_storage_ptr__->d).size = 0;
        return __return_storage_ptr__;
      }
      goto LAB_0032450f;
    }
    QVar1 = rgba(this);
    QString::number((uint)&QStack_48,QVar1 | 0x1000000);
    bVar2 = (ulong)QStack_48.size < 6;
    uStack_50 = 6;
  }
  if (bVar2) {
    uStack_50 = QStack_48.size;
  }
  local_30.b.m_data =
       (storage_type_conflict *)
       ((long)QStack_48.ptr + (QStack_48.size * 2 - (ulong)(uint)((int)uStack_50 * 2)));
  local_30.a = L'#';
  local_30.b.m_size = uStack_50;
  QStringBuilder<char16_t,_QStringView>::convertTo<QString>(__return_storage_ptr__,&local_30);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
LAB_0032450f:
  __stack_chk_fail();
}

Assistant:

QString QColor::name(NameFormat format) const
{
    switch (format) {
    case HexRgb:
        return u'#' + QStringView{QString::number(rgba() | 0x1000000, 16)}.right(6);
    case HexArgb:
        // it's called rgba() but it does return AARRGGBB
        return u'#' + QStringView{QString::number(rgba() | Q_INT64_C(0x100000000), 16)}.right(8);
    }
    return QString();
}